

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
pstore::json::parser<pstore::exchange::import_ns::callbacks>::parser
          (parser<pstore::exchange::import_ns::callbacks> *this,callbacks *callbacks,
          extensions extensions)

{
  pointer psVar1;
  undefined1 local_70 [24];
  unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  local_58;
  deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_> local_41;
  unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  local_40 [2];
  extensions local_1c;
  callbacks *pcStack_18;
  extensions extensions_local;
  callbacks *callbacks_local;
  parser<pstore::exchange::import_ns::callbacks> *this_local;
  
  local_1c = extensions;
  pcStack_18 = callbacks;
  callbacks_local = (callbacks *)this;
  psVar1 = (pointer)operator_new(0x68);
  std::
  unique_ptr<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>>>
  ::
  unique_ptr<std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>>,void>
            ((unique_ptr<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>>>
              *)this,psVar1);
  std::
  stack<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>,std::deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>,std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>>>>
  ::
  stack<std::deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>,std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>>>,void>
            ((stack<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>,std::deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>,std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>>>>
              *)&this->stack_);
  std::error_code::error_code(&this->error_);
  exchange::import_ns::callbacks::callbacks(&this->callbacks_,callbacks);
  this->extensions_ = local_1c;
  std::__cxx11::string::string((string *)&this->string_);
  coord::coord(&this->coordinate_,1,1);
  psVar1 = std::
           unique_ptr<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
           ::operator->(&this->singletons_);
  details::eof_matcher<pstore::exchange::import_ns::callbacks>::eof_matcher
            ((eof_matcher<pstore::exchange::import_ns::callbacks> *)psVar1);
  details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>::deleter
            (&local_41,false);
  std::
  unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>
  ::
  unique_ptr<pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>,void>
            ((unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>
              *)local_40,(pointer)psVar1,&local_41);
  std::
  stack<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>_>
  ::push(&this->stack_,(value_type *)local_40);
  std::
  unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  ::~unique_ptr(local_40);
  psVar1 = std::
           unique_ptr<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
           ::operator->(&this->singletons_);
  details::whitespace_matcher<pstore::exchange::import_ns::callbacks>::whitespace_matcher
            ((whitespace_matcher<pstore::exchange::import_ns::callbacks> *)
             &(psVar1->trailing_ws).__align);
  details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>::deleter
            ((deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_> *)
             (local_70 + 0x17),false);
  std::
  unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>
  ::
  unique_ptr<pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>,void>
            ((unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>
              *)&local_58,(pointer)&(psVar1->trailing_ws).__align,
             (deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_> *)
             (local_70 + 0x17));
  std::
  stack<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>_>
  ::push(&this->stack_,(value_type *)&local_58);
  std::
  unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  ::~unique_ptr(&local_58);
  make_root_matcher((parser<pstore::exchange::import_ns::callbacks> *)local_70,SUB81(this,0));
  std::
  stack<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>_>
  ::push(&this->stack_,(value_type *)local_70);
  std::
  unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  ::~unique_ptr((unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
                 *)local_70);
  return;
}

Assistant:

parser<Callbacks>::parser (Callbacks callbacks, extensions const extensions)
                : callbacks_ (std::move (callbacks))
                , extensions_{extensions} {

            using mpointer = typename matcher::pointer;
            using deleter = typename mpointer::deleter_type;
            // The EOF matcher is placed at the bottom of the stack to ensure that the input JSON
            // ends after a single top-level object.
            stack_.push (mpointer (new (&singletons_->eof) details::eof_matcher<Callbacks>{},
                                   deleter{false}));
            // We permit whitespace after the top-level object.
            stack_.push (mpointer (new (&singletons_->trailing_ws)
                                       details::whitespace_matcher<Callbacks>{},
                                   deleter{false}));
            stack_.push (this->make_root_matcher ());
        }